

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

void __thiscall ObjectBlockPool<32,_2048>::CollectUnmarked(ObjectBlockPool<32,_2048> *this)

{
  SmallBlock<32> **ppSVar1;
  ulong uVar2;
  uint newSize;
  FastVector<SmallBlock<32>_*,_false,_false> *this_00;
  MyLargeBlock *pMVar3;
  SmallBlock<32> *pSVar4;
  ulong uVar5;
  SmallBlock<32> *local_48;
  FastVector<SmallBlock<32>_*,_false,_false> *local_40;
  FastVector<SmallBlock<32>_*,_false,_false> *local_38;
  
  pMVar3 = this->activePages;
  if (pMVar3 != (MyLargeBlock *)0x0) {
    local_38 = &this->objectsToFree;
    local_40 = &this->objectsToFinalize;
    do {
      if ((pMVar3 != this->activePages) || (this->lastNum != 0)) {
        pSVar4 = pMVar3->page;
        uVar5 = 0;
        do {
          if ((pSVar4->marker & 3) == 0) {
            if (((uint)pSVar4->marker & 0xc) == 4) {
              newSize = (this->objectsToFinalize).count;
              this_00 = local_40;
              if (newSize != (this->objectsToFinalize).max) {
                ppSVar1 = (this->objectsToFinalize).data;
                (this->objectsToFinalize).count = newSize + 1;
LAB_001213c4:
                ppSVar1[newSize] = pSVar4;
                goto LAB_001213c8;
              }
            }
            else {
              newSize = (this->objectsToFree).count;
              this_00 = local_38;
              if (newSize != (this->objectsToFree).max) {
                ppSVar1 = (this->objectsToFree).data;
                (this->objectsToFree).count = newSize + 1;
                goto LAB_001213c4;
              }
            }
            local_48 = pSVar4;
            FastVector<SmallBlock<32>_*,_false,_false>::grow_and_add(this_00,newSize,&local_48);
          }
LAB_001213c8:
          uVar5 = uVar5 + 1;
          uVar2 = (ulong)this->lastNum;
          if (pMVar3 != this->activePages) {
            uVar2 = 0x800;
          }
          pSVar4 = pSVar4 + 1;
        } while (uVar5 < uVar2);
      }
      pMVar3 = pMVar3->next;
    } while (pMVar3 != (LargeBlock<32,_2048> *)0x0);
  }
  return;
}

Assistant:

void CollectUnmarked()
	{
		for(MyLargeBlock *curr = activePages; curr; curr = curr->next)
		{
			for(unsigned int i = 0; i < (curr == activePages ? lastNum : countInBlock); i++)
			{
				markerType &marker = curr->page[i].marker;

				if(!(marker & (NULLC::OBJECT_VISIBLE | NULLC::OBJECT_FREED)))
				{
					if((marker & NULLC::OBJECT_FINALIZABLE) && !(marker & NULLC::OBJECT_FINALIZED))
					{
						objectsToFinalize.push_back(&curr->page[i]);
					}
					else
					{
						objectsToFree.push_back(&curr->page[i]);
					}
				}
			}
		}
	}